

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_qemu_st_i32_mips64el
               (TCGContext_conflict6 *tcg_ctx,TCGv_i32 val,TCGv_i64 addr,TCGArg idx,
               MemOp_conflict2 memop)

{
  MemOp_conflict2 memop_00;
  
  memop_00 = tcg_canonicalize_memop(memop,false,true);
  gen_ldst_i32(tcg_ctx,INDEX_op_qemu_st_i32,val,addr,memop_00,idx);
  check_exit_request_mips64el(tcg_ctx);
  return;
}

Assistant:

void tcg_gen_qemu_st_i32(TCGContext *tcg_ctx, TCGv_i32 val, TCGv addr, TCGArg idx, MemOp memop)
{
    TCGv_i32 swap = NULL;

    tcg_gen_req_mo(tcg_ctx, TCG_MO_LD_ST | TCG_MO_ST_ST);
    memop = tcg_canonicalize_memop(memop, 0, 1);

#if !TCG_TARGET_HAS_MEMORY_BSWAP
    if (memop & MO_BSWAP) {
        swap = tcg_temp_new_i32(tcg_ctx);
        switch (memop & MO_SIZE) {
        case MO_16:
            tcg_gen_ext16u_i32(tcg_ctx, swap, val);
            tcg_gen_bswap16_i32(tcg_ctx, swap, swap);
            break;
        case MO_32:
            tcg_gen_bswap32_i32(tcg_ctx, swap, val);
            break;
        default:
            g_assert_not_reached();
        }
        val = swap;
        memop &= ~MO_BSWAP;
    }
#endif

    gen_ldst_i32(tcg_ctx, INDEX_op_qemu_st_i32, val, addr, memop, idx);

    if (swap) {
        tcg_temp_free_i32(tcg_ctx, swap);
    }

    check_exit_request(tcg_ctx);
}